

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol_p.h
# Opt level: O0

bool __thiscall QWidgetLineControl::composeMode(QWidgetLineControl *this)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QTextLayout::preeditAreaText();
  bVar2 = QString::isEmpty((QString *)0x5cccee);
  QString::~QString((QString *)0x5cccfd);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return !bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool composeMode() const { return !m_textLayout.preeditAreaText().isEmpty(); }